

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::
Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
::~Stack(Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
         *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  
  for (puVar2 = *(undefined8 **)(this + 0x10); puVar1 = *(undefined8 **)(this + 8), puVar2 != puVar1
      ; puVar2 = puVar2 + -8) {
    mpz_clear((__mpz_struct *)(puVar2 + -5));
    mpz_clear((__mpz_struct *)(puVar2 + -7));
  }
  if (puVar1 != (undefined8 *)0x0) {
    if (*(long *)this << 6 == 0) {
      *puVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = puVar1;
    }
    else {
      if (0x40 < (ulong)(*(long *)this << 6)) {
        operator_delete(puVar1,0x10);
        return;
      }
      *puVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = puVar1;
    }
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }